

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

void __thiscall pbrt::TransformedSceneEntity::TransformedSceneEntity(TransformedSceneEntity *this)

{
  SceneEntity::SceneEntity(&this->super_SceneEntity);
  AnimatedTransform::AnimatedTransform(&this->renderFromObject);
  return;
}

Assistant:

TransformedSceneEntity() = default;